

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<double,_std::allocator<double>_> *
clickhouse::SliceVector<double>
          (vector<double,_std::allocator<double>_> *vec,size_t begin,size_t len)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *p_Var1;
  size_type sVar2;
  unsigned_long *puVar3;
  const_iterator __first;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *result;
  vector<double,_std::allocator<double>_> *__n;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *this;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffffa8;
  unsigned_long local_30;
  undefined1 local_21;
  unsigned_long local_20;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_21 = 0;
  __n = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x21a67e);
  this = local_18;
  p_Var1 = (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
           std::vector<double,_std::allocator<double>_>::size(local_10);
  if (this < p_Var1) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(local_10);
    local_30 = sVar2 - (long)local_18;
    puVar3 = std::min<unsigned_long>(&local_20,&local_30);
    local_20 = *puVar3;
    std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator+(this,(difference_type)__n);
    __first = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator+(this,(difference_type)__n);
    std::vector<double,std::allocator<double>>::
    assign<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              (in_stack_ffffffffffffffa0,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               __first._M_current,in_stack_ffffffffffffffa8);
  }
  return __n;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}